

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_355c8::testPerturbedRayBoxEntryExit(Box3f *box,Line3f *ray,bool result)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  void *this;
  byte in_DL;
  V3f s_1;
  V3f r_1;
  Line3f ray1;
  int i;
  float e;
  Rand48 random;
  V3f s;
  V3f r;
  Line3<float> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff7c;
  Rand48 *in_stack_ffffffffffffff88;
  Vec3<float> local_60 [2];
  Vec3<float> VStack_48;
  int local_3c;
  undefined4 local_38;
  Vec3<float> *in_stack_ffffffffffffffd0;
  Vec3<float> *in_stack_ffffffffffffffd8;
  Box<Imath_3_2::Vec3<float>_> *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  std::operator<<((ostream *)&std::cout,"    dir ~ ");
  poVar4 = Imath_3_2::operator<<
                     ((ostream *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      &in_stack_ffffffffffffff68->pos);
  poVar4 = std::operator<<(poVar4,", result = ");
  this = (void *)std::ostream::operator<<(poVar4,(bool)(bVar1 & 1));
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffe0);
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffd4);
  bVar2 = (bool)(bVar1 & 1);
  bVar3 = Imath_3_2::findEntryAndExitPoints<float>
                    ((Line3<float> *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (bVar2 != bVar3) {
    __assert_fail("result == findEntryAndExitPoints (ray, box, r, s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x144,
                  "void (anonymous namespace)::testPerturbedRayBoxEntryExit(const Box3f &, const Line3f &, bool)"
                 );
  }
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (unsigned_long)in_stack_ffffffffffffff68);
  local_38 = 0x15f79688;
  local_3c = 0;
  while( true ) {
    if (9999 < local_3c) {
      return;
    }
    Imath_3_2::Line3<float>::Line3
              ((Line3<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    Imath_3_2::solidSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>(in_stack_ffffffffffffff88);
    Imath_3_2::operator*
              (in_stack_ffffffffffffff7c,
               (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    Imath_3_2::Vec3<float>::operator+=(&VStack_48,local_60);
    Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff88);
    Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff7c);
    in_stack_ffffffffffffff74 = (uint)(bVar1 & 1);
    bVar2 = Imath_3_2::findEntryAndExitPoints<float>
                      ((Line3<float> *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0
                      );
    if (in_stack_ffffffffffffff74 != bVar2) break;
    local_3c = local_3c + 1;
  }
  __assert_fail("result == findEntryAndExitPoints (ray1, box, r, s)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                ,0x150,
                "void (anonymous namespace)::testPerturbedRayBoxEntryExit(const Box3f &, const Line3f &, bool)"
               );
}

Assistant:

void
testPerturbedRayBoxEntryExit (const Box3f& box, const Line3f& ray, bool result)
{
    cout << "    dir ~ " << ray.dir << ", result = " << result << endl;

    {
        V3f r, s;
        assert (result == findEntryAndExitPoints (ray, box, r, s));
    }

    Rand48      random (19);
    const float e = 1e-25f;

    for (int i = 0; i < 10000; ++i)
    {
        Line3f ray1 (ray);
        ray1.dir += e * solidSphereRand<V3f> (random);

        V3f r, s;
        assert (result == findEntryAndExitPoints (ray1, box, r, s));
    }
}